

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZFunction<std::complex<float>_>_> * __thiscall
TPZAutoPointer<TPZFunction<std::complex<float>_>_>::operator=
          (TPZAutoPointer<TPZFunction<std::complex<float>_>_> *this,
          TPZAutoPointer<TPZFunction<std::complex<float>_>_> *copy)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  bool bVar3;
  
  pTVar2 = this->fRef;
  if (copy->fRef != pTVar2) {
    if (pTVar2 != (TPZReference *)0x0) {
      bVar3 = TPZReference::Decrease(pTVar2);
      if (bVar3) {
        Release(this);
      }
    }
    pTVar2 = copy->fRef;
    this->fRef = pTVar2;
    LOCK();
    paVar1 = &pTVar2->fCounter;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

TPZAutoPointer &operator=(const TPZAutoPointer<T> &copy)
	{
		if(copy.fRef == fRef) return *this;		
        else if (fRef && fRef->Decrease()){
            Release();
        }
		fRef = copy.fRef;
        copy.fRef->Increment();
        
		return *this;
	}